

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O1

bool __thiscall Js::JavascriptMap::Delete(JavascriptMap *this,Var key)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  pTVar3 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  TVar2 = this->kind;
  if (TVar2 != EmptyMap) {
    if (TVar2 == ComplexVarMap) {
      bVar5 = DeleteFromVarMap<true>(this,key);
      goto LAB_00ce2b13;
    }
    if (TVar2 == SimpleVarMap) {
      bVar5 = DeleteFromSimpleVarMap(this,key);
      goto LAB_00ce2b13;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x18a,"((0))","(0)");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  bVar5 = false;
LAB_00ce2b13:
  pTVar3->noJsReentrancy = bVar1;
  return bVar5;
}

Assistant:

bool
JavascriptMap::Delete(Var key)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());

    switch (this->kind)
    {
    case MapKind::EmptyMap:
        return false;

    case MapKind::SimpleVarMap:
        return this->DeleteFromSimpleVarMap(key);
    case MapKind::ComplexVarMap:
        return this->DeleteFromVarMap<true>(key);
    default:
        Assume(UNREACHED);
        return false;
    }
}